

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

gen_digits_params fmt::v5::internal::process_specs(core_format_specs *specs,int exp,buffer *buf)

{
  char cVar1;
  uint3 uVar2;
  gen_digits_params gVar3;
  undefined4 uVar4;
  type new_size;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  gen_digits_params params;
  char_counter counter;
  
  params.num_digits = 0;
  params.fixed = false;
  params.upper = false;
  params.trailing_zeros = false;
  params._7_1_ = 0;
  gVar3 = params;
  params.fixed = false;
  params.upper = false;
  params.trailing_zeros = false;
  params._7_1_ = 0;
  uVar4 = params._4_4_;
  params.fixed = false;
  params.upper = false;
  params.trailing_zeros = false;
  params._7_1_ = 0;
  uVar6 = 6;
  if (-1 < specs->precision) {
    uVar6 = specs->precision;
  }
  cVar1 = specs->type;
  uVar7 = uVar6;
  if (cVar1 != '\0') {
    if (cVar1 == 'E') {
      params.fixed = false;
      params.upper = true;
      params.trailing_zeros = false;
      params._7_1_ = 0;
      uVar4 = params._4_4_;
LAB_0010ab4e:
      params._4_4_ = uVar4;
      uVar7 = uVar6 + 1;
      goto LAB_0010ab50;
    }
    if (cVar1 == 'F') {
      params.num_digits = 0;
      params.fixed = false;
      params.upper = true;
      params.trailing_zeros = false;
      params._7_1_ = 0;
      gVar3 = params;
LAB_0010ab35:
      params = gVar3;
      params.num_digits = 0;
      params.fixed = true;
      params.trailing_zeros = true;
      uVar2 = params._4_3_;
      params._7_1_ = 0;
      params.fixed = (bool)(char)uVar2;
      params.upper = (bool)(char)(uVar2 >> 8);
      params.trailing_zeros = (bool)(char)(uVar2 >> 0x10);
      if (0 < (int)(uVar6 + exp)) {
        uVar7 = uVar6 + exp;
      }
      goto LAB_0010ab50;
    }
    if (cVar1 != 'g') {
      if (cVar1 == 'e') goto LAB_0010ab4e;
      if (cVar1 == 'f') goto LAB_0010ab35;
      if (cVar1 != 'G') goto LAB_0010ab50;
      params.num_digits = 0;
      params.fixed = false;
      params.upper = true;
      params.trailing_zeros = false;
      params._7_1_ = 0;
      gVar3 = params;
    }
  }
  params = gVar3;
  bVar5 = specs->flags >> 3;
  params = (gen_digits_params)((ulong)CONCAT16(bVar5,params._0_6_) & 0xff01ffffffffffff);
  if (exp <= (int)uVar6 && -5 < exp) {
    params.num_digits = 0;
    params.fixed = true;
    if (cVar1 == '\0') {
      uVar7 = exp + 1;
      if ((bVar5 & 1) == 0) {
        uVar7 = uVar6;
      }
      if (exp < 0) {
        uVar7 = uVar6;
      }
    }
  }
LAB_0010ab50:
  params.num_digits = uVar7;
  counter.size = (ptrdiff_t)uVar7;
  grisu2_prettify<fmt::v5::internal::char_counter&>(&params,uVar7,exp - uVar7,&counter);
  new_size = to_unsigned<long>(counter.size);
  basic_buffer<char>::resize(buf,new_size);
  return params;
}

Assistant:

FMT_FUNC gen_digits_params process_specs(const core_format_specs &specs,
                                         int exp, buffer &buf) {
  auto params = gen_digits_params();
  int num_digits = specs.precision >= 0 ? specs.precision : 6;
  switch (specs.type) {
  case 'G':
    params.upper = true;
    FMT_FALLTHROUGH
  case '\0': case 'g':
    params.trailing_zeros = (specs.flags & HASH_FLAG) != 0;
    if (-4 <= exp && exp < num_digits + 1) {
      params.fixed = true;
      if (!specs.type && params.trailing_zeros && exp >= 0)
        num_digits = exp + 1;
    }
    break;
  case 'F':
    params.upper = true;
    FMT_FALLTHROUGH
  case 'f': {
    params.fixed = true;
    params.trailing_zeros = true;
    int adjusted_min_digits = num_digits + exp;
    if (adjusted_min_digits > 0)
      num_digits = adjusted_min_digits;
    break;
  }
  case 'E':
    params.upper = true;
    FMT_FALLTHROUGH
  case 'e':
    ++num_digits;
    break;
  }
  params.num_digits = num_digits;
  char_counter counter{num_digits};
  grisu2_prettify(params, params.num_digits, exp - num_digits, counter);
  buf.resize(to_unsigned(counter.size));
  return params;
}